

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O0

void ui_leave_world(game_event_type type,game_event_data *data,void *user)

{
  void *user_local;
  game_event_data *data_local;
  game_event_type type_local;
  
  smlcurs = true;
  event_remove_handler_set(player_events,0xd,update_sidebar,(void *)0x0);
  event_remove_handler_set(statusline_events,6,update_statusline,(void *)0x0);
  event_remove_handler(EVENT_HP,hp_colour_change,(void *)0x0);
  event_remove_handler(EVENT_MAP,update_maps,angband_term[0]);
  event_remove_handler(EVENT_PLAYERMOVED,check_panel,(void *)0x0);
  event_remove_handler(EVENT_SEEFLOOR,see_floor_items,(void *)0x0);
  event_remove_handler(EVENT_EXPLOSION,display_explosion,(void *)0x0);
  event_remove_handler(EVENT_BOLT,display_bolt,(void *)0x0);
  event_remove_handler(EVENT_MISSILE,display_missile,(void *)0x0);
  event_remove_handler(EVENT_PAUSE,pause_display,(void *)0x0);
  event_remove_handler(EVENT_CHECK_INTERRUPT,check_for_player_interrupt,(void *)0x0);
  event_remove_handler(EVENT_REFRESH,refresh,(void *)0x0);
  event_remove_handler(EVENT_NEW_LEVEL_DISPLAY,new_level_display_update,(void *)0x0);
  event_remove_handler(EVENT_COMMAND_REPEAT,repeated_command_display,(void *)0x0);
  event_remove_handler(EVENT_ANIMATE,animate,(void *)0x0);
  event_remove_handler(EVENT_CHEAT_DEATH,cheat_death,(void *)0x0);
  event_add_handler(EVENT_USE_STORE,use_store,(void *)0x0);
  event_add_handler(EVENT_LEAVE_STORE,leave_store,(void *)0x0);
  screen_save_depth = screen_save_depth + 1;
  return;
}

Assistant:

static void ui_leave_world(game_event_type type, game_event_data *data,
						  void *user)
{
	/* Disallow big cursor */
	smlcurs = true;

	/* Because of the "flexible" sidebar, all these things trigger
	   the same function. */
	event_remove_handler_set(player_events, N_ELEMENTS(player_events),
			      update_sidebar, NULL);

	/* The flexible statusbar has similar requirements, so is
	   also trigger by a large set of events. */
	event_remove_handler_set(statusline_events, N_ELEMENTS(statusline_events),
			      update_statusline, NULL);

	/* Player HP can optionally change the colour of the '@' now. */
	event_remove_handler(EVENT_HP, hp_colour_change, NULL);

	/* Simplest way to keep the map up to date - will do for now */
	event_remove_handler(EVENT_MAP, update_maps, angband_term[0]);
#ifdef MAP_DEBUG
	event_remove_handler(EVENT_MAP, trace_map_updates, angband_term[0]);
#endif

	/* Check if the panel should shift when the player's moved */
	event_remove_handler(EVENT_PLAYERMOVED, check_panel, NULL);

	/* Take note of what's on the floor */
	event_remove_handler(EVENT_SEEFLOOR, see_floor_items, NULL);

	/* Display an explosion */
	event_remove_handler(EVENT_EXPLOSION, display_explosion, NULL);

	/* Display a bolt spell */
	event_remove_handler(EVENT_BOLT, display_bolt, NULL);

	/* Display a physical missile */
	event_remove_handler(EVENT_MISSILE, display_missile, NULL);

	/* Pause for effect */
	event_remove_handler(EVENT_PAUSE, pause_display, NULL);

	/* Check to see if the player has tried to cancel game processing */
	event_remove_handler(EVENT_CHECK_INTERRUPT, check_for_player_interrupt, NULL);

	/* Refresh the screen and put the cursor in the appropriate place */
	event_remove_handler(EVENT_REFRESH, refresh, NULL);

	/* Do the visual updates required on a new dungeon level */
	event_remove_handler(EVENT_NEW_LEVEL_DISPLAY, new_level_display_update, NULL);

	/* Automatically clear messages while the game is repeating commands */
	event_remove_handler(EVENT_COMMAND_REPEAT, repeated_command_display, NULL);

	/* Do animations (e.g. monster colour changes) */
	event_remove_handler(EVENT_ANIMATE, animate, NULL);

	/* Allow the player to cheat death, if appropriate */
	event_remove_handler(EVENT_CHEAT_DEATH, cheat_death, NULL);

	/* Prepare to interact with a store */
	event_add_handler(EVENT_USE_STORE, use_store, NULL);

	/* If we've gone into a store, we need to know how to leave */
	event_add_handler(EVENT_LEAVE_STORE, leave_store, NULL);

	/* Hack -- Increase "icky" depth */
	screen_save_depth++;
}